

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O2

bool google::protobuf::compiler::annotation_test_util::AtLeastOneAnnotationMatchesSubstring
               (string *file_content,
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *annotations,string *expected_text,
               optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic> semantic)

{
  uint uVar1;
  pointer ppGVar2;
  GeneratedCodeInfo_Annotation *pGVar3;
  __type _Var4;
  pointer ppGVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppGVar5 = (annotations->
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (annotations->
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppGVar5 == ppGVar2) {
      return false;
    }
    pGVar3 = *ppGVar5;
    uVar1 = (pGVar3->field_0)._impl_.end_;
    if (uVar1 < (uint)(pGVar3->field_0)._impl_.begin_) {
      return false;
    }
    if (file_content->_M_string_length < (ulong)uVar1) {
      return false;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)file_content);
    _Var4 = std::operator==(&local_50,expected_text);
    std::__cxx11::string::~string((string *)&local_50);
    ppGVar5 = ppGVar5 + 1;
  } while (!_Var4);
  bVar6 = true;
  if (((ulong)semantic.
              super__Optional_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_true,_true>
              ._M_payload.
              super__Optional_payload_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
       >> 0x20 & 1) != 0) {
    bVar6 = (pGVar3->field_0)._impl_.semantic_ ==
            semantic.
            super__Optional_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_true,_true>
            ._M_payload.
            super__Optional_payload_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>.
            _M_payload;
  }
  return bVar6;
}

Assistant:

bool AtLeastOneAnnotationMatchesSubstring(
    const std::string& file_content,
    const std::vector<const GeneratedCodeInfo::Annotation*>& annotations,
    const std::string& expected_text,
    absl::optional<GeneratedCodeInfo::Annotation::Semantic> semantic) {
  for (std::vector<const GeneratedCodeInfo::Annotation*>::const_iterator
           i = annotations.begin(),
           e = annotations.end();
       i != e; ++i) {
    const GeneratedCodeInfo::Annotation* annotation = *i;
    uint32_t begin = annotation->begin();
    uint32_t end = annotation->end();
    if (end < begin || end > file_content.size()) {
      return false;
    }
    if (file_content.substr(begin, end - begin) == expected_text) {
      return !semantic || annotation->semantic() == *semantic;
    }
  }
  return false;
}